

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::global_programs_dir(void)

{
  Path *in_RDI;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"/opt",&local_31);
  Path(in_RDI,&local_30);
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

Path Path::global_programs_dir()
{
#if defined(_PATHIE_UNIX)
  return Path("/opt");
#elif defined(_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_PROGRAM_FILES, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));

#else
#error Unsupported system.
#endif
}